

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool get_ini_data(OpenJTalk *oj)

{
  _Bool _Var1;
  ConfigScanner *sc;
  ConfigItem *pCVar2;
  ulong uVar3;
  char *pcVar4;
  double dVar5;
  double temp_double;
  int temp_int;
  double local_40;
  uint local_34;
  double local_30;
  
  if (g_ini_path[0] != '\0') {
    if (g_verbose) {
      get_ini_data_cold_1();
    }
    sc = config_load(g_ini_path);
    if (sc != (ConfigScanner *)0x0) {
      pCVar2 = config_find(sc,G_SECTION_NAME,"voice_dir");
      if ((pCVar2 != (ConfigItem *)0x0) && (pCVar2->vtype == VTYPE_STRING)) {
        if (oj->dn_voice_dir_path[0] == '\0') {
          pcVar4 = (pCVar2->value).v_string;
          if (g_verbose != false) {
            fprintf(_stderr,anon_var_dwarf_604,pcVar4);
          }
          set_config_voice_dir(oj,pcVar4);
        }
        else if (g_verbose != false) {
          get_ini_data_cold_2();
        }
      }
      pCVar2 = config_find(sc,G_SECTION_NAME,"dic_dir");
      if ((pCVar2 != (ConfigItem *)0x0) && (pCVar2->vtype == VTYPE_STRING)) {
        if (oj->dn_dic_path[0] == '\0') {
          _Var1 = set_config_dic_dir(oj,(pCVar2->value).v_string);
          if ((_Var1) || (g_verbose == false)) goto LAB_0013f1f1;
        }
        else if (g_verbose != true) goto LAB_0013f1f1;
        get_ini_data_cold_3();
      }
LAB_0013f1f1:
      pCVar2 = config_find(sc,G_SECTION_NAME,"voice");
      if ((pCVar2 != (ConfigItem *)0x0) && (pCVar2->vtype == VTYPE_STRING)) {
        if (oj->fn_voice_path[0] == '\0') {
          pcVar4 = (pCVar2->value).v_string;
          if (g_verbose != false) {
            fprintf(_stderr,anon_var_dwarf_653,pcVar4);
          }
          set_config_voice(oj,pcVar4);
        }
        else if (g_verbose != false) {
          get_ini_data_cold_4();
        }
      }
      _Var1 = config_find_integer(sc,G_SECTION_NAME,"sampling_frequency",(int *)&local_34);
      if (_Var1) {
        uVar3 = (ulong)local_34;
        if (g_verbose == true) {
          fprintf(_stderr,"config sampling_frequency: %d\n",uVar3);
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          if (uVar3 == 0) {
            oj->errorCode = OPENJTALKERROR_VALUE_ERROR;
          }
          else {
            oj->sampling_frequency = uVar3;
            Open_JTalk_set_sampling_frequency(oj->open_jtalk,uVar3);
          }
        }
      }
      _Var1 = config_find_integer(sc,G_SECTION_NAME,"s",(int *)&local_34);
      if (_Var1) {
        uVar3 = (ulong)local_34;
        if (g_verbose == true) {
          fprintf(_stderr,"config s: %d\n",uVar3);
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          if (uVar3 == 0) {
            oj->errorCode = OPENJTALKERROR_VALUE_ERROR;
          }
          else {
            oj->sampling_frequency = uVar3;
            Open_JTalk_set_sampling_frequency(oj->open_jtalk,uVar3);
          }
        }
      }
      _Var1 = config_find_integer(sc,G_SECTION_NAME,"fperiod",(int *)&local_34);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_5();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          uVar3 = (ulong)(local_34 + (local_34 == 0));
          oj->fperiod = uVar3;
          Open_JTalk_set_fperiod(oj->open_jtalk,uVar3);
        }
      }
      _Var1 = config_find_integer(sc,G_SECTION_NAME,"p",(int *)&local_34);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_6();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          uVar3 = (ulong)(local_34 + (local_34 == 0));
          oj->fperiod = uVar3;
          Open_JTalk_set_fperiod(oj->open_jtalk,uVar3);
        }
      }
      pcVar4 = G_SECTION_NAME;
      _Var1 = config_find_double(sc,G_SECTION_NAME,"alpha",&local_40);
      if (_Var1) {
        dVar5 = local_40;
        if (g_verbose == true) {
          local_30 = local_40;
          fprintf(_stderr,"config alpha: %f\n",local_40);
          dVar5 = local_30;
        }
        openjtalk_setAlpha(oj,dVar5);
        pcVar4 = G_SECTION_NAME;
      }
      _Var1 = config_find_double(sc,pcVar4,"a",&local_40);
      if (_Var1) {
        dVar5 = local_40;
        if (g_verbose == true) {
          local_30 = local_40;
          fprintf(_stderr,"config a: %f\n",local_40);
          dVar5 = local_30;
        }
        openjtalk_setAlpha(oj,dVar5);
        pcVar4 = G_SECTION_NAME;
      }
      _Var1 = config_find_double(sc,pcVar4,"beta",&local_40);
      if (_Var1) {
        dVar5 = local_40;
        if (g_verbose == true) {
          local_30 = local_40;
          fprintf(_stderr,"config beta: %f\n",local_40);
          dVar5 = local_30;
        }
        openjtalk_setBeta(oj,dVar5);
        pcVar4 = G_SECTION_NAME;
      }
      _Var1 = config_find_double(sc,pcVar4,"b",&local_40);
      if (_Var1) {
        dVar5 = local_40;
        if (g_verbose == true) {
          local_30 = local_40;
          fprintf(_stderr,"config b: %f\n",local_40);
          dVar5 = local_30;
        }
        openjtalk_setBeta(oj,dVar5);
        pcVar4 = G_SECTION_NAME;
      }
      _Var1 = config_find_double(sc,pcVar4,"speed",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_7();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          dVar5 = 0.0;
          if (0.0 <= local_40) {
            dVar5 = local_40;
          }
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->speed = dVar5;
          Open_JTalk_set_speed(oj->open_jtalk,dVar5);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"r",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_8();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          dVar5 = 0.0;
          if (0.0 <= local_40) {
            dVar5 = local_40;
          }
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->speed = dVar5;
          Open_JTalk_set_speed(oj->open_jtalk,dVar5);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"additional_half_tone",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_9();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->additional_half_tone = local_40;
          Open_JTalk_set_additional_half_tone(oj->open_jtalk,local_40);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"fm",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_10();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->additional_half_tone = local_40;
          Open_JTalk_set_additional_half_tone(oj->open_jtalk,local_40);
        }
      }
      pcVar4 = G_SECTION_NAME;
      _Var1 = config_find_double(sc,G_SECTION_NAME,"msd_threshold",&local_40);
      if (_Var1) {
        dVar5 = local_40;
        if (g_verbose == true) {
          local_30 = local_40;
          fprintf(_stderr,"config msd_threshold: %f\n",local_40);
          dVar5 = local_30;
        }
        openjtalk_setMsdThreshold(oj,dVar5);
        pcVar4 = G_SECTION_NAME;
      }
      _Var1 = config_find_double(sc,pcVar4,"u",&local_40);
      if (_Var1) {
        dVar5 = local_40;
        if (g_verbose == true) {
          local_30 = local_40;
          get_ini_data_cold_11();
          dVar5 = local_30;
        }
        openjtalk_setMsdThreshold(oj,dVar5);
        pcVar4 = G_SECTION_NAME;
      }
      _Var1 = config_find_double(sc,pcVar4,"gv_weight_for_spectrum",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_12();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          dVar5 = 0.0;
          if (0.0 <= local_40) {
            dVar5 = local_40;
          }
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->gv_weight0 = dVar5;
          Open_JTalk_set_gv_weight(oj->open_jtalk,0,dVar5);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"jm",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_13();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          dVar5 = 0.0;
          if (0.0 <= local_40) {
            dVar5 = local_40;
          }
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->gv_weight0 = dVar5;
          Open_JTalk_set_gv_weight(oj->open_jtalk,0,dVar5);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"gv_weight_for_log_f0",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_14();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          dVar5 = 0.0;
          if (0.0 <= local_40) {
            dVar5 = local_40;
          }
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->gv_weight1 = dVar5;
          Open_JTalk_set_gv_weight(oj->open_jtalk,1,dVar5);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"jf",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_15();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          dVar5 = 0.0;
          if (0.0 <= local_40) {
            dVar5 = local_40;
          }
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->gv_weight1 = dVar5;
          Open_JTalk_set_gv_weight(oj->open_jtalk,1,dVar5);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"volume",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_16();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->volume = local_40;
          Open_JTalk_set_volume(oj->open_jtalk,local_40);
        }
      }
      _Var1 = config_find_double(sc,G_SECTION_NAME,"g",&local_40);
      if (_Var1) {
        if (g_verbose == true) {
          get_ini_data_cold_17();
        }
        if (oj == (OpenJTalk *)0x0) {
          g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
        }
        else {
          oj->errorCode = OPENJTALKERROR_NO_ERROR;
          oj->volume = local_40;
          Open_JTalk_set_volume(oj->open_jtalk,local_40);
        }
      }
      config_free(sc);
      if (g_verbose == true) {
        get_ini_data_cold_18();
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool get_ini_data(OpenJTalk *oj)
{
	if (strlen(g_ini_path) == 0)
	{
		return false;
	}

	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　開始 *****\n");
	}

	ConfigScanner *sc = config_load(g_ini_path);
	if (sc == NULL)
	{
		return false;
	}

	char *temp;
	if (config_find_string(sc, G_SECTION_NAME, u8"voice_dir", &temp))
	{
		if (strlen(oj->dn_voice_dir_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice_dir： %s\n", temp);
			}
			set_config_voice_dir(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"dic_dir", &temp))
	{
		if (strlen(oj->dn_dic_path) == 0)
		{
			if (!set_config_dic_dir(oj, temp))
			{
				if (g_verbose)
				{
					console_message(u8"warning: 設定ファイルからの辞書ファイルの設定に失敗しました。\n");
				}
			}
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config dic_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"voice", &temp))
	{
		if (strlen(oj->fn_voice_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice： %s\n", temp);
			}
			set_config_voice(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice: 無視\n");
			}
		}
	}

	int temp_int;
	if (config_find_integer(sc, G_SECTION_NAME, u8"sampling_frequency", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config sampling_frequency: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"s", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config s: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"fperiod", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config fperiod: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"p", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config p: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}

	double temp_double;
	if (config_find_double(sc, G_SECTION_NAME, u8"alpha", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config alpha: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"a", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config a: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"beta", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config beta: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"b", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config b: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"speed", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config speed: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"r", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config r: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"additional_half_tone", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config additional_half_tone: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"fm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config fm: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"msd_threshold", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config msd_threshold: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"u", &temp_double))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config u: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_spectrum", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_spectrum: %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jm： %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_log_f0", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_log_f0: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jf", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jf: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"volume", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config volume: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"g", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config g: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	config_free(sc);
	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　終了 *****\n");
	}
	return true;
}